

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ast.h
# Opt level: O2

void __thiscall ast::LessThanOrEqual::LessThanOrEqual(LessThanOrEqual *this,Token *t,int line)

{
  Token TStack_48;
  
  token::Token::Token(&TStack_48,t);
  BinaryOp::BinaryOp(&this->super_BinaryOp,&TStack_48,1,0,line);
  token::Token::~Token(&TStack_48);
  (this->super_BinaryOp).super_Op.super_Expr.super_Node._vptr_Node =
       (_func_int **)&PTR__BinaryOp_001694b0;
  return;
}

Assistant:

LessThanOrEqual(Token t, int line)
        :BinaryOp(t, PRECENDENCE::LT_EQ, ASSOCIATION::LEFT, line){}